

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O3

DispatchCallResult __thiscall
capnp::DynamicCapability::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  uint index;
  undefined4 uVar3;
  undefined4 uVar4;
  Reader RVar5;
  DispatchCallResult DVar6;
  Method method;
  NullableValue<capnp::InterfaceSchema> _interface61;
  StructSchema resultType;
  MethodList methods;
  Method local_d8;
  char local_98;
  Schema local_90;
  PointerReader local_88;
  MethodList local_68;
  
  InterfaceSchema::findSuperclass(&local_d8.parent,interfaceId + 0x10);
  local_98 = (char)local_d8.parent.super_Schema.raw;
  if ((char)local_d8.parent.super_Schema.raw == '\x01') {
    InterfaceSchema::getMethods(&local_68,(InterfaceSchema *)&local_90);
    index = (uint)context.hook & 0xffff;
    if (index < local_68.list.reader.elementCount) {
      capnp::_::ListReader::getStructElement(&local_d8.proto._reader,&local_68.list.reader,index);
      local_d8.ordinal = (uint16_t)context.hook;
      local_88.segment = (SegmentReader *)InterfaceSchema::Method::getResultType(&local_d8);
      InterfaceSchema::Method::getParamType(&local_d8);
      (**(code **)(*(long *)interfaceId + 0x18))(this,interfaceId);
      bVar1 = StructSchema::isStreamResult((StructSchema *)&local_88);
      *(bool *)&(this->super_Server).thisHook.ptr = bVar1;
      *(undefined1 *)((long)&(this->super_Server).thisHook.ptr + 1) =
           *(undefined1 *)(interfaceId + 0x18);
      uVar2 = extraout_RDX;
    }
    else {
      Schema::getProto((Reader *)&local_d8,&local_90);
      bVar1 = local_d8.proto._reader.data._4_2_ == 0;
      local_88.pointer = (WirePointer *)local_d8.proto._reader.capTable;
      if (bVar1) {
        local_88.pointer = (WirePointer *)0x0;
      }
      local_88.nestingLimit = 0x7fffffff;
      if (!bVar1) {
        local_88.nestingLimit = (int)local_d8.proto._reader.pointers;
      }
      local_88.capTable._0_4_ = 0;
      uVar3 = 0;
      uVar4 = 0;
      local_88.capTable._4_4_ = 0;
      if (!bVar1) {
        local_88.capTable._0_4_ = CONCAT22(local_d8._10_2_,local_d8.ordinal);
        uVar3 = local_d8.parent.super_Schema.raw._0_4_;
        uVar4 = local_d8.parent.super_Schema.raw._4_4_;
        local_88.capTable._4_4_ = local_d8._12_4_;
      }
      local_88.segment = (SegmentReader *)CONCAT44(uVar4,uVar3);
      RVar5 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_88,(void *)0x0,0);
      DVar6 = Capability::Server::internalUnimplemented
                        (&this->super_Server,(char *)interfaceId,
                         (uint64_t)RVar5.super_StringPtr.content.ptr,methodId);
      uVar2 = DVar6._8_8_;
    }
  }
  else {
    Schema::getProto((Reader *)&local_d8,(Schema *)(interfaceId + 0x10));
    bVar1 = local_d8.proto._reader.data._4_2_ == 0;
    local_68.list.reader.capTable = local_d8.proto._reader.capTable;
    if (bVar1) {
      local_68.list.reader.capTable = (CapTableReader *)(WirePointer *)0x0;
    }
    local_68.list.reader.ptr._0_4_ = 0x7fffffff;
    if (!bVar1) {
      local_68.list.reader.ptr._0_4_ = (int)local_d8.proto._reader.pointers;
    }
    local_68.list.reader.segment._0_4_ = 0;
    local_68.parent.super_Schema.raw._0_4_ = 0;
    local_68.parent.super_Schema.raw._4_4_ = 0;
    local_68.list.reader.segment._4_4_ = 0;
    if (!bVar1) {
      local_68.list.reader.segment._0_4_ = CONCAT22(local_d8._10_2_,local_d8.ordinal);
      local_68.parent.super_Schema.raw._0_4_ = local_d8.parent.super_Schema.raw._0_4_;
      local_68.parent.super_Schema.raw._4_4_ = local_d8.parent.super_Schema.raw._4_4_;
      local_68.list.reader.segment._4_4_ = local_d8._12_4_;
    }
    RVar5 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_68,(void *)0x0,0);
    DVar6 = Capability::Server::internalUnimplemented
                      (&this->super_Server,(char *)interfaceId,
                       (uint64_t)RVar5.super_StringPtr.content.ptr);
    uVar2 = DVar6._8_8_;
  }
  DVar6.isStreaming = (bool)(char)uVar2;
  DVar6.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar6._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar6.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar6;
}

Assistant:

Capability::Server::DispatchCallResult DynamicCapability::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    CallContext<AnyPointer, AnyPointer> context) {
  KJ_IF_SOME(interface, schema.findSuperclass(interfaceId)) {
    auto methods = interface.getMethods();
    if (methodId < methods.size()) {
      auto method = methods[methodId];
      auto resultType = method.getResultType();
      return {
        call(method, CallContext<DynamicStruct, DynamicStruct>(*context.hook,
            method.getParamType(), resultType)),
        resultType.isStreamResult(),
        options.allowCancellation
      };
    } else {
      return internalUnimplemented(
          interface.getProto().getDisplayName().cStr(), interfaceId, methodId);
    }
  } else {
    return internalUnimplemented(schema.getProto().getDisplayName().cStr(), interfaceId);
  }